

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::assign(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint parts;
  Significand *src;
  Significand *dst;
  
  if (this->semantics != rhs->semantics) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x29e,"void llvm::detail::IEEEFloat::assign(const IEEEFloat &)");
  }
  bVar4 = rhs->field_0x12 & 8;
  bVar6 = this->field_0x12;
  this->field_0x12 = bVar6 & 0xf7 | bVar4;
  bVar1 = rhs->field_0x12;
  bVar5 = bVar1 & 7;
  this->field_0x12 = bVar6 & 0xf0 | bVar4 | bVar5;
  this->exponent = rhs->exponent;
  if ((bVar5 != 1) && ((bVar1 & 6) == 0 || bVar5 == 3)) {
    return;
  }
  bVar6 = this->field_0x12 & 7;
  if ((bVar6 != 1) && ((this->field_0x12 & 6) == 0 || bVar6 == 3)) {
    __assert_fail("isFiniteNonZero() || category == fcNaN",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x2a8,"void llvm::detail::IEEEFloat::copySignificand(const IEEEFloat &)");
  }
  uVar2 = rhs->semantics->precision;
  uVar3 = this->semantics->precision;
  parts = uVar3 + 0x40 >> 6;
  if (parts <= uVar2 + 0x40 >> 6) {
    if (uVar3 - 0x40 < 0xffffff80) {
      dst = (Significand *)(this->significand).parts;
    }
    else {
      dst = &this->significand;
    }
    if (uVar2 - 0x40 < 0xffffff80) {
      src = (Significand *)(rhs->significand).parts;
    }
    else {
      src = &rhs->significand;
    }
    APInt::tcAssign(&dst->part,&src->part,parts);
    return;
  }
  __assert_fail("rhs.partCount() >= partCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x2a9,"void llvm::detail::IEEEFloat::copySignificand(const IEEEFloat &)");
}

Assistant:

void IEEEFloat::assign(const IEEEFloat &rhs) {
  assert(semantics == rhs.semantics);

  sign = rhs.sign;
  category = rhs.category;
  exponent = rhs.exponent;
  if (isFiniteNonZero() || category == fcNaN)
    copySignificand(rhs);
}